

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstatemanager_tests.cpp
# Opt level: O1

void __thiscall
validation_chainstatemanager_tests::chainstatemanager_snapshot_completion_hash_mismatch::test_method
          (chainstatemanager_snapshot_completion_hash_mismatch *this)

{
  FastRandomContext *this_00;
  long lVar1;
  _Head_base<0UL,_Chainstate_*,_false> _Var2;
  string message;
  MatchFn match;
  char cVar3;
  bool bVar4;
  byte bVar5;
  SnapshotCompletionResult SVar6;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar7;
  CCoinsViewCache *this_01;
  uint64_t uVar8;
  ChainstateManager *this_02;
  unit_test_log_t *puVar9;
  Chainstate *pCVar10;
  int iVar11;
  char *pcVar12;
  iterator pvVar13;
  iterator in_R9;
  iterator pvVar14;
  long in_FS_OFFSET;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  check_type cVar16;
  undefined8 in_stack_fffffffffffffb58;
  ChainstateManager *pCVar15;
  TestChain100Setup *this_03;
  undefined8 in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  _Manager_type in_stack_fffffffffffffb88;
  _Invoker_type in_stack_fffffffffffffb90;
  undefined1 *local_468;
  undefined1 *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  undefined1 *local_438;
  undefined1 *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined4 local_3e4;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_3e0;
  long local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> all_chainstates;
  assertion_result local_298;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  code *local_248;
  code *local_240;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  SnapshotCompletionResult res;
  tuple<Chainstate_*,_Chainstate_*> chainstates;
  undefined1 local_1e8 [8];
  undefined1 local_1e0 [8];
  begin local_1d8;
  undefined8 local_1c0;
  assertion_result local_1b8;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock62;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock63;
  assertion_result local_180;
  _Head_base<0UL,_interfaces::Chain_*,_false> local_168;
  path local_160;
  _Head_base<0UL,_CScheduler_*,_false> local_138;
  undefined1 local_128 [16];
  path snapshot_invalid_dir;
  path local_c0;
  path snapshot_chainstate_dir;
  Coin badcoin;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SnapshotTestSetup::SetupSnapshot((SnapshotTestSetup *)&chainstates);
  pcVar12 = "m_node.chainman";
  puVar7 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&(this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
                       super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
                      ,0x2c8,"test_method","m_node.chainman");
  pCVar15 = (puVar7->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  ((this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
   super_ChainTestingSetup.super_BasicTestingSetup.m_node.notifications._M_t.
   super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>
   ._M_t.
   super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
   .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl)->
  m_shutdown_on_fatal_error = false;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = (pointer)&cs_main;
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock
            ((unique_lock<std::recursive_mutex> *)&snapshot_invalid_dir);
  this_01 = Chainstate::CoinsTip
                      (chainstates.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
                       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&snapshot_invalid_dir);
  CTxOut::CTxOut(&badcoin.out);
  badcoin._40_4_ = 0;
  this_00 = &(this->super_SnapshotTestSetup).super_TestChain100Setup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_rng;
  uVar8 = RandomMixin<FastRandomContext>::randbits<32>
                    (&this_00->super_RandomMixin<FastRandomContext>);
  badcoin.out.nValue = uVar8 & 0xffffffff;
  badcoin._40_4_ = badcoin._40_4_ & 1 | 2;
  uVar8 = RandomMixin<FastRandomContext>::randbits(&this_00->super_RandomMixin<FastRandomContext>,6)
  ;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p =
       snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p & 0xffffffffffffff00;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
            (&badcoin.out.scriptPubKey.super_CScriptBase,(size_type)uVar8,
             (uchar *)&snapshot_invalid_dir);
  snapshot_chainstate_dir.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  snapshot_chainstate_dir.super_path._M_pathname.field_2._8_8_ = 0;
  snapshot_chainstate_dir.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  snapshot_chainstate_dir.super_path._M_pathname._M_string_length = 0;
  output.m_size = 0x20;
  output.m_data = (byte *)&snapshot_chainstate_dir;
  FastRandomContext::fillrand(this_00,output);
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       snapshot_chainstate_dir.super_path._M_pathname.field_2._M_allocated_capacity;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ =
       snapshot_chainstate_dir.super_path._M_pathname.field_2._8_8_;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus =
       snapshot_chainstate_dir.super_path._M_pathname._M_dataplus;
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_chainstate_dir.super_path._M_pathname._M_string_length;
  snapshot_invalid_dir.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl._0_4_ =
       0;
  CCoinsViewCache::AddCoin(this_01,(COutPoint *)&snapshot_invalid_dir,&badcoin,false);
  ArgsManager::GetDataDir((path *)&local_c0,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&local_c0,0x13,"chainstate_snapshot");
  std::filesystem::__cxx11::path::path(&snapshot_chainstate_dir.super_path,&local_c0);
  std::filesystem::__cxx11::path::~path(&local_c0);
  local_210 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x2d8;
  file.m_begin = (iterator)&local_210;
  msg.m_end = in_R9;
  msg.m_begin = pcVar12;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_220,msg);
  _cVar16 = 0x778e49;
  cVar3 = std::filesystem::status(&snapshot_chainstate_dir.super_path);
  local_180.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(cVar3 != -1 && cVar3 != '\0');
  local_180.m_message.px = (element_type *)0x0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1d8.m_file_name.m_begin = (iterator)((long)"!fs::exists(snapshot_chainstate_dir)" + 1);
  local_1d8.m_file_name.m_end = (iterator)((long)"!fs::exists(snapshot_chainstate_dir)" + 0x24);
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "@;\x1f";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_228 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = &local_1d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_180,(lazy_ostream *)&snapshot_invalid_dir,1,0,WARN,_cVar16,(size_t)&local_230,
             0x2d8);
  boost::detail::shared_count::~shared_count(&local_180.m_message.pn);
  local_138._M_head_impl = (CScheduler *)local_128;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,"failed to validate the -assumeutxo snapshot state","");
  local_258 = 0;
  uStack_250 = 0;
  local_240 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_manager;
  message._M_string_length = (size_type)pCVar15;
  message._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb58;
  message.field_2._M_allocated_capacity = (size_type)this;
  message.field_2._8_8_ =
       chainstates.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffb80;
  match.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_fffffffffffffb78;
  match.super__Function_base._M_manager = in_stack_fffffffffffffb88;
  match._M_invoker = in_stack_fffffffffffffb90;
  DebugLogHelper::DebugLogHelper((DebugLogHelper *)&snapshot_invalid_dir,message,match);
  pCVar10 = chainstates.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,3);
    pCVar10 = chainstates.super__Tuple_impl<0UL,_Chainstate_*,_Chainstate_*>.
              super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl;
  }
  if (local_138._M_head_impl != (CScheduler *)local_128) {
    operator_delete(local_138._M_head_impl,local_128._0_8_ + 1);
  }
  local_180._0_8_ = &cs_main;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&local_180);
  SVar6 = ChainstateManager::MaybeCompleteSnapshotValidation(pCVar15);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&local_180);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2dd;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar14;
  msg_00.m_begin = pvVar13;
  res = SVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  local_298.m_message.px = (element_type *)((ulong)local_298.m_message.px & 0xffffffffffffff00);
  local_298._0_8_ = &PTR__lazy_ostream_013abb30;
  local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&res;
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(res == HASH_MISMATCH);
  criticalblock63.super_unique_lock._M_device = (mutex_type *)&criticalblock62;
  criticalblock62.super_unique_lock._M_device =
       (mutex_type *)CONCAT44(criticalblock62.super_unique_lock._M_device._4_4_,4);
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_1e5889c;
  all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf76bbe;
  local_168._M_head_impl = (Chain *)&local_3e0;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013b1800;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1d8.m_file_name.m_end = (iterator)((ulong)local_1d8.m_file_name.m_end & 0xffffffffffffff00);
  local_1d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013b1800;
  local_1d8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_1c0 = (CConnman *)&criticalblock63;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_298,1,2,REQUIRE,0xf8108b,(size_t)&all_chainstates,
             0x2dd,(unique_lock<std::recursive_mutex> *)&local_180,
             "SnapshotCompletionResult::HASH_MISMATCH",&local_1d8);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  DebugLogHelper::~DebugLogHelper((DebugLogHelper *)&snapshot_invalid_dir);
  ChainstateManager::GetAll(&all_chainstates,pCVar15);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x2e1;
  file_01.m_begin = (iterator)&local_2c0;
  msg_01.m_end = pvVar14;
  msg_01.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2d0,
             msg_01);
  local_1d8.m_file_name.m_end = (iterator)((ulong)local_1d8.m_file_name.m_end & 0xffffffffffffff00);
  local_1d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013abb30;
  local_1d8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  criticalblock62.super_unique_lock._M_device =
       (mutex_type *)
       ((long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3);
  criticalblock63.super_unique_lock._M_device = (mutex_type *)local_1e0;
  local_1e0._0_4_ = 1;
  local_298.m_message.px = (element_type *)0x0;
  local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1b8.m_message.px =
       (element_type *)
       ((long)
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b);
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&criticalblock62;
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "@;\x1f";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = &local_3e0;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_168._M_head_impl = (Chain *)&criticalblock63;
  local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
              _M_impl.super__Vector_impl_data._M_start == 8);
  boost::test_tools::tt_detail::report_assertion
            (&local_298,(lazy_ostream *)&local_1d8,1,2,REQUIRE,0xf778be,(size_t)&local_1b8,0x2e1,
             &snapshot_invalid_dir,"1",&local_180);
  boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x2e2;
  file_02.m_begin = (iterator)&local_2e0;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2f0,
             msg_02);
  local_1d8.m_file_name.m_end = (iterator)((ulong)local_1d8.m_file_name.m_end & 0xffffffffffffff00);
  local_1d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013abb30;
  local_1d8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (*all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
         super__Vector_impl_data._M_start == pCVar10);
  local_298.m_message.px = (element_type *)0x0;
  local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1b8.m_message.px =
       (element_type *)
       ((long)
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b);
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "@;\x1f";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = &local_3e0;
  criticalblock63.super_unique_lock._M_device = (mutex_type *)&criticalblock62;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013b1780;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_168._M_head_impl = (Chain *)&criticalblock63;
  boost::test_tools::tt_detail::report_assertion
            (&local_298,(lazy_ostream *)&local_1d8,1,2,REQUIRE,0xf77b56,(size_t)&local_1b8,0x2e2,
             &snapshot_invalid_dir,"&validation_chainstate",&local_180);
  boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
  local_300 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x2e3;
  file_03.m_begin = (iterator)&local_300;
  msg_03.m_end = pvVar14;
  msg_03.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_310,
             msg_03);
  local_1d8.m_file_name.m_end = (iterator)((ulong)local_1d8.m_file_name.m_end & 0xffffffffffffff00);
  local_1d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013abb30;
  local_1d8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  local_1c0 = "";
  criticalblock62.super_unique_lock._M_device =
       (mutex_type *)ChainstateManager::ActiveChainstate(pCVar15);
  local_298.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((Chainstate *)criticalblock62.super_unique_lock._M_device == pCVar10);
  local_298.m_message.px = (element_type *)0x0;
  local_298.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1b8.m_message.px =
       (element_type *)
       ((long)
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b);
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&criticalblock62;
  snapshot_invalid_dir.super_path._M_pathname._M_string_length =
       snapshot_invalid_dir.super_path._M_pathname._M_string_length & 0xffffffffffffff00;
  snapshot_invalid_dir.super_path._M_pathname._M_dataplus._M_p = "@;\x1f";
  snapshot_invalid_dir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  snapshot_invalid_dir.super_path._M_pathname.field_2._8_8_ = &local_3e0;
  criticalblock63.super_unique_lock._M_device = (mutex_type *)local_1e0;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013b1780;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_168._M_head_impl = (Chain *)&criticalblock63;
  boost::test_tools::tt_detail::report_assertion
            (&local_298,(lazy_ostream *)&local_1d8,1,2,REQUIRE,0xf77d86,(size_t)&local_1b8,0x2e3,
             &snapshot_invalid_dir,"&validation_chainstate",&local_180);
  boost::detail::shared_count::~shared_count(&local_298.m_message.pn);
  ArgsManager::GetDataDir((path *)&local_160,&gArgs,true);
  std::filesystem::__cxx11::path::_M_append(&local_160,0x1b,"chainstate_snapshot_INVALID");
  std::filesystem::__cxx11::path::path(&snapshot_invalid_dir.super_path,&local_160);
  std::filesystem::__cxx11::path::~path(&local_160);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x2e6;
  file_04.m_begin = (iterator)&local_320;
  msg_04.m_end = pvVar14;
  msg_04.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_330,
             msg_04);
  _cVar16 = 0x779601;
  cVar3 = std::filesystem::status(&snapshot_invalid_dir.super_path);
  local_1d8.m_file_name.m_begin =
       (iterator)CONCAT71(local_1d8.m_file_name.m_begin._1_7_,cVar3 != -1 && cVar3 != '\0');
  local_1d8.m_file_name.m_end = (iterator)0x0;
  local_1d8.m_line_num = 0;
  local_298._0_8_ = "fs::exists(snapshot_invalid_dir)";
  local_298.m_message.px = (element_type *)0xf77bd3;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abc70;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_338 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_168._M_head_impl = (Chain *)&local_298;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)&local_180,1,0,WARN,_cVar16,
             (size_t)&local_340,0x2e6);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8.m_line_num);
  this_03 = (TestChain100Setup *)this;
  this_02 = SnapshotTestSetup::SimulateNodeRestart(&this->super_SnapshotTestSetup);
  local_1d8.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1d8.m_file_name.m_end =
       (iterator)
       ((long)
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b);
  local_1d8.m_line_num = 0x2ed;
  puVar9 = boost::unit_test::unit_test_log_t::operator<<
                     (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_298,(log_level)puVar9);
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013acb20;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_168._M_head_impl = (Chain *)0xf7794d;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_298,(lazy_ostream *)&local_180);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_298);
  ChainTestingSetup::LoadVerifyActivateChainstate((ChainTestingSetup *)this);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x2f3;
  file_05.m_begin = (iterator)&local_350;
  msg_05.m_end = pvVar14;
  msg_05.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_360,
             msg_05);
  _cVar16 = 0x77979d;
  cVar3 = std::filesystem::status(&snapshot_invalid_dir.super_path);
  local_1d8.m_file_name.m_end = (iterator)0x0;
  local_1d8.m_line_num = 0;
  local_298._0_8_ = "fs::exists(snapshot_invalid_dir)";
  local_298.m_message.px = (element_type *)0xf77bd3;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abc70;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_368 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_168._M_head_impl = (Chain *)&local_298;
  local_1d8.m_file_name.m_begin._0_1_ = cVar3 != -1 && cVar3 != '\0';
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)&local_180,1,0,WARN,_cVar16,
             (size_t)&local_370,0x2f3);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8.m_line_num);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x2f4;
  file_06.m_begin = (iterator)&local_380;
  msg_06.m_end = pvVar14;
  msg_06.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_390,
             msg_06);
  _cVar16 = 0x77987b;
  cVar3 = std::filesystem::status(&snapshot_chainstate_dir.super_path);
  local_1d8.m_file_name.m_begin =
       (iterator)CONCAT71(local_1d8.m_file_name.m_begin._1_7_,cVar3 == -1 || cVar3 == '\0');
  local_1d8.m_file_name.m_end = (iterator)0x0;
  local_1d8.m_line_num = 0;
  local_298._0_8_ = "!fs::exists(snapshot_chainstate_dir)";
  local_298.m_message.px = (element_type *)0xf77bf8;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abc70;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_398 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_168._M_head_impl = (Chain *)&local_298;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)&local_180,1,0,WARN,_cVar16,
             (size_t)&local_3a0,0x2f4);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8.m_line_num);
  criticalblock62.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock62.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock62.super_unique_lock);
  local_3b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x2f8;
  file_07.m_begin = (iterator)&local_3b0;
  msg_07.m_end = pvVar14;
  msg_07.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_3c0,
             msg_07);
  local_298.m_message.px = (element_type *)((ulong)local_298.m_message.px & 0xffffffffffffff00);
  local_298._0_8_ = &PTR__lazy_ostream_013abb30;
  local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  pCVar15 = this_02;
  ChainstateManager::GetAll(&local_3e0,this_02);
  local_3c8 = (long)local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3;
  local_1e0 = (undefined1  [8])&local_3c8;
  local_1e8 = (undefined1  [8])&local_3e4;
  local_3e4 = 1;
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       ((long)local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start == 8);
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  criticalblock63.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_1e5889c;
  criticalblock63.super_unique_lock._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abb70;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_168._M_head_impl = (Chain *)local_1e0;
  local_1c0 = local_1e8;
  local_1d8.m_file_name.m_end = (iterator)((ulong)local_1d8.m_file_name.m_end & 0xffffffffffffff00);
  local_1d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013abcf0;
  local_1d8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_298,1,2,REQUIRE,0xf7797b,(size_t)&criticalblock63,
             0x2f8,(lazy_ostream *)&local_180,"1",&local_1d8);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  if ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
      local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start != (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)0x0)
  {
    operator_delete(local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x2f9;
  file_08.m_begin = (iterator)&local_3f8;
  msg_08.m_end = pvVar14;
  msg_08.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_408,
             msg_08);
  _cVar16 = 0x779b49;
  bVar4 = ChainstateManager::IsSnapshotActive(this_02);
  local_1d8.m_file_name.m_end = (iterator)0x0;
  local_1d8.m_line_num = 0;
  local_298._0_8_ = "!chainman_restarted.IsSnapshotActive()";
  local_298.m_message.px = (element_type *)0xf77c1f;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abc70;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_410 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_168._M_head_impl = (Chain *)&local_298;
  local_1d8.m_file_name.m_begin._0_1_ = !bVar4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)&local_180,1,0,WARN,_cVar16,
             (size_t)&local_418,0x2f9);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8.m_line_num);
  local_428 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_420 = "";
  local_438 = &boost::unit_test::basic_cstring<char_const>::null;
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar16 = 0x779c14;
  file_09.m_end = (iterator)0x2fa;
  file_09.m_begin = (iterator)&local_428;
  msg_09.m_end = pvVar14;
  msg_09.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_438,
             msg_09);
  bVar5 = 1;
  if (((pCVar15->m_snapshot_chainstate)._M_t.
       super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
       super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
       super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
     (_Var2._M_head_impl =
           (pCVar15->m_ibd_chainstate)._M_t.
           super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
           super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
           super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
     _Var2._M_head_impl != (Chainstate *)0x0)) {
    bVar5 = (_Var2._M_head_impl)->m_disabled ^ 1;
  }
  local_1d8.m_file_name.m_begin = (iterator)CONCAT71(local_1d8.m_file_name.m_begin._1_7_,bVar5);
  local_1d8.m_file_name.m_end = (iterator)0x0;
  local_1d8.m_line_num = 0;
  local_298._0_8_ = "!chainman_restarted.IsSnapshotValidated()";
  local_298.m_message.px = (element_type *)0xf779c7;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abc70;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_440 = "";
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x0;
  local_168._M_head_impl = (Chain *)&local_298;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d8,(lazy_ostream *)&local_180,1,0,WARN,_cVar16,
             (size_t)&local_448,0x2fa);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1d8.m_line_num);
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_450 = "";
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x2fb;
  file_10.m_begin = (iterator)&local_458;
  msg_10.m_end = pvVar14;
  msg_10.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_468,
             msg_10);
  local_298.m_message.px = (element_type *)((ulong)local_298.m_message.px & 0xffffffffffffff00);
  local_298._0_8_ = &PTR__lazy_ostream_013abb30;
  local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  pCVar10 = ChainstateManager::ActiveChainstate(pCVar15);
  iVar11 = (int)((ulong)((long)(pCVar10->m_chain).vChain.
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pCVar10->m_chain).vChain.
                              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  local_3c8._0_4_ = 0xd2;
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf76b43;
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf76bbe;
  criticalblock63.super_unique_lock._M_device = (mutex_type *)local_1e8;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = (undefined1  [8])&local_3c8;
  local_1d8.m_file_name.m_end = (iterator)((ulong)local_1d8.m_file_name.m_end & 0xffffffffffffff00);
  local_1d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013abcf0;
  local_1d8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  local_1c0 = local_1e0;
  pvVar13 = (iterator)0x1;
  pvVar14 = (iterator)0x2;
  local_168._M_head_impl = (Chain *)&criticalblock63;
  local_1e8._0_4_ = iVar11;
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar11 == 0xd2);
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_298,1,2,REQUIRE,0xf77a09,(size_t)&local_3e0,0x2fb,
             (lazy_ostream *)&local_180,"210",&local_1d8);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock62.super_unique_lock);
  local_1d8.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
  ;
  local_1d8.m_file_name.m_end =
       (iterator)
       ((long)
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/validation_chainstatemanager_tests.cpp"
       + 0x7b);
  local_1d8.m_line_num = 0x2ff;
  puVar9 = boost::unit_test::unit_test_log_t::operator<<
                     (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d8);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_298,(log_level)puVar9);
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013acbe0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_168._M_head_impl = (Chain *)0xf77ca4;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_298,(lazy_ostream *)&local_180);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_298);
  TestChain100Setup::mineBlocks(this_03,10);
  criticalblock63.super_unique_lock._M_device = &cs_main.super_recursive_mutex;
  criticalblock63.super_unique_lock._8_8_ =
       criticalblock63.super_unique_lock._8_8_ & 0xffffffffffffff00;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock63.super_unique_lock);
  file_11.m_end = (iterator)0x303;
  file_11.m_begin = &stack0xfffffffffffffb88;
  msg_11.m_end = pvVar14;
  msg_11.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,
             (size_t)&stack0xfffffffffffffb78,msg_11);
  local_298.m_message.px = (element_type *)((ulong)local_298.m_message.px & 0xffffffffffffff00);
  local_298._0_8_ = &PTR__lazy_ostream_013abb30;
  local_298.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_280 = "";
  pCVar10 = ChainstateManager::ActiveChainstate(pCVar15);
  local_1e8._0_4_ =
       (int)((ulong)((long)(pCVar10->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)(pCVar10->m_chain).vChain.
                          super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3) + -1;
  local_3c8 = CONCAT44(local_3c8._4_4_,0xdc);
  local_1b8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_1e8._0_4_ == 0xdc);
  local_1b8.m_message.px = (element_type *)0x0;
  local_1b8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xf76b43;
  local_3e0.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf76bbe;
  criticalblock62.super_unique_lock._M_device = (mutex_type *)local_1e8;
  local_180.m_message.px = (element_type *)((ulong)local_180.m_message.px & 0xffffffffffffff00);
  local_180._0_8_ = &PTR__lazy_ostream_013abcf0;
  local_180.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1e0 = (undefined1  [8])&local_3c8;
  local_1d8.m_file_name.m_end = (iterator)((ulong)local_1d8.m_file_name.m_end & 0xffffffffffffff00);
  local_1d8.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_013abcf0;
  local_1d8.m_line_num = (size_t)boost::unit_test::lazy_ostream::inst;
  local_1c0 = local_1e0;
  local_168._M_head_impl = (Chain *)&criticalblock62;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,(lazy_ostream *)&local_298,1,2,REQUIRE,0xf77a09,(size_t)&local_3e0,0x303,
             (lazy_ostream *)&local_180,"220",&local_1d8);
  boost::detail::shared_count::~shared_count(&local_1b8.m_message.pn);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock63.super_unique_lock);
  std::filesystem::__cxx11::path::~path(&snapshot_invalid_dir.super_path);
  if (all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(all_chainstates.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)all_chainstates.
                          super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)all_chainstates.
                          super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::filesystem::__cxx11::path::~path(&snapshot_chainstate_dir.super_path);
  if (0x1c < badcoin.out.scriptPubKey.super_CScriptBase._size) {
    free(badcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
    badcoin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstatemanager_snapshot_completion_hash_mismatch, SnapshotTestSetup)
{
    auto chainstates = this->SetupSnapshot();
    Chainstate& validation_chainstate = *std::get<0>(chainstates);
    ChainstateManager& chainman = *Assert(m_node.chainman);
    SnapshotCompletionResult res;
    m_node.notifications->m_shutdown_on_fatal_error = false;

    // Test tampering with the IBD UTXO set with an extra coin to ensure it causes
    // snapshot completion to fail.
    CCoinsViewCache& ibd_coins = WITH_LOCK(::cs_main,
        return validation_chainstate.CoinsTip());
    Coin badcoin;
    badcoin.out.nValue = m_rng.rand32();
    badcoin.nHeight = 1;
    badcoin.out.scriptPubKey.assign(m_rng.randbits(6), 0);
    Txid txid = Txid::FromUint256(m_rng.rand256());
    ibd_coins.AddCoin(COutPoint(txid, 0), std::move(badcoin), false);

    fs::path snapshot_chainstate_dir = gArgs.GetDataDirNet() / "chainstate_snapshot";
    BOOST_CHECK(fs::exists(snapshot_chainstate_dir));

    {
        ASSERT_DEBUG_LOG("failed to validate the -assumeutxo snapshot state");
        res = WITH_LOCK(::cs_main, return chainman.MaybeCompleteSnapshotValidation());
        BOOST_CHECK_EQUAL(res, SnapshotCompletionResult::HASH_MISMATCH);
    }

    auto all_chainstates = chainman.GetAll();
    BOOST_CHECK_EQUAL(all_chainstates.size(), 1);
    BOOST_CHECK_EQUAL(all_chainstates[0], &validation_chainstate);
    BOOST_CHECK_EQUAL(&chainman.ActiveChainstate(), &validation_chainstate);

    fs::path snapshot_invalid_dir = gArgs.GetDataDirNet() / "chainstate_snapshot_INVALID";
    BOOST_CHECK(fs::exists(snapshot_invalid_dir));

    // Test that simulating a shutdown (resetting ChainstateManager) and then performing
    // chainstate reinitializing successfully loads only the fully-validated
    // chainstate data, and we end up with a single chainstate that is at tip.
    ChainstateManager& chainman_restarted = this->SimulateNodeRestart();

    BOOST_TEST_MESSAGE("Performing Load/Verify/Activate of chainstate");

    // This call reinitializes the chainstates, and should clean up the now unnecessary
    // background-validation leveldb contents.
    this->LoadVerifyActivateChainstate();

    BOOST_CHECK(fs::exists(snapshot_invalid_dir));
    BOOST_CHECK(!fs::exists(snapshot_chainstate_dir));

    {
        LOCK(::cs_main);
        BOOST_CHECK_EQUAL(chainman_restarted.GetAll().size(), 1);
        BOOST_CHECK(!chainman_restarted.IsSnapshotActive());
        BOOST_CHECK(!chainman_restarted.IsSnapshotValidated());
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 210);
    }

    BOOST_TEST_MESSAGE(
        "Ensure we can mine blocks on top of the \"new\" IBD chainstate");
    mineBlocks(10);
    {
        LOCK(::cs_main);
        BOOST_CHECK_EQUAL(chainman_restarted.ActiveHeight(), 220);
    }
}